

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeDSK.cpp
# Opt level: O1

int __thiscall FormatTypeDSK::FillTrack(FormatTypeDSK *this,uchar *track_buffer,int side,int track)

{
  unsigned_short uVar1;
  uint uVar2;
  Track **ppTVar3;
  Track *pTVar4;
  int iVar5;
  ulong uVar6;
  uint k;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  CRC crc;
  ulong local_60;
  CRC local_58;
  
  uVar2 = 0;
  iVar5 = 0x50;
  do {
    uVar2 = IDisk::AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = 0xc;
  do {
    uVar2 = IDisk::AddByteToTrack(track_buffer,uVar2,'\0',8,'\0');
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  uVar2 = IDisk::AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  uVar2 = IDisk::AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  uVar2 = IDisk::AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  uVar2 = IDisk::AddByteToTrack(track_buffer,uVar2,0xfc,8,'\0');
  iVar5 = 0x32;
  do {
    uVar2 = IDisk::AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  if (this->side_[side].tracks[track].nb_sector != 0) {
    ppTVar3 = &this->side_[side].tracks;
    local_60 = 0;
    do {
      CRC::CRC(&local_58);
      CRC::Reset(&local_58);
      iVar5 = 0xc;
      do {
        uVar2 = IDisk::AddByteWithCrc(track_buffer,uVar2,'\0',&local_58,false);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      CRC::Reset(&local_58);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,uVar2,0xa1,&local_58,true);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&local_58,true);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&local_58,true);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xfe,&local_58,false);
      iVar5 = IDisk::AddByteWithCrc
                        (track_buffer,iVar5,(*ppTVar3)[track].sectors[local_60].track,&local_58,
                         false);
      iVar5 = IDisk::AddByteWithCrc
                        (track_buffer,iVar5,(*ppTVar3)[track].sectors[local_60].side,&local_58,false
                        );
      iVar5 = IDisk::AddByteWithCrc
                        (track_buffer,iVar5,(*ppTVar3)[track].sectors[local_60].sector_id,&local_58,
                         false);
      iVar5 = IDisk::AddByteWithCrc
                        (track_buffer,iVar5,(*ppTVar3)[track].sectors[local_60].sector_size,
                         &local_58,false);
      uVar1 = local_58.computed_crc_;
      iVar5 = IDisk::AddByteWithCrc
                        (track_buffer,iVar5,(uchar)(local_58.computed_crc_ >> 8),&local_58,false);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,(uchar)uVar1,&local_58,false);
      CRC::Reset(&local_58);
      iVar7 = 0x16;
      do {
        iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,'N',&local_58,false);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      iVar7 = 0xc;
      do {
        iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,'\0',&local_58,false);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      CRC::Reset(&local_58);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&local_58,true);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&local_58,true);
      iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&local_58,true);
      iVar5 = IDisk::AddByteWithCrc
                        (track_buffer,iVar5,
                         (((*ppTVar3)[track].sectors[local_60].fdc_status_2 & 0x40) == 0) * '\x03' +
                         0xf8,&local_58,false);
      uVar6 = (ulong)(*ppTVar3)[track].sectors[local_60].actual_size;
      if (uVar6 != 0) {
        uVar8 = 0;
        do {
          iVar5 = IDisk::AddByteWithCrc
                            (track_buffer,iVar5,(*ppTVar3)[track].sectors[local_60].data[uVar8],
                             &local_58,false);
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      uVar1 = local_58.computed_crc_;
      iVar5 = IDisk::AddByteWithoutCrc
                        (track_buffer,iVar5,(uchar)(local_58.computed_crc_ >> 8),false);
      uVar2 = IDisk::AddByteWithoutCrc(track_buffer,iVar5,(uchar)uVar1,false);
      CRC::Reset(&local_58);
      pTVar4 = *ppTVar3;
      if (pTVar4[track].gap3 != '\0') {
        uVar9 = 0;
        do {
          uVar2 = IDisk::AddByteWithoutCrc(track_buffer,uVar2,pTVar4[track].gap3_filter,false);
          uVar9 = uVar9 + 1;
          pTVar4 = *ppTVar3;
        } while (uVar9 < pTVar4[track].gap3);
      }
      CRC::~CRC(&local_58);
      local_60 = local_60 + 1;
    } while (local_60 < (*ppTVar3)[track].nb_sector);
  }
  if ((int)uVar2 < 0x4000) {
    do {
      iVar5 = IDisk::AddByteWithoutCrc(track_buffer,uVar2,'N',false);
      uVar2 = iVar5 + 1;
    } while (iVar5 < 0x3fff);
  }
  return uVar2;
}

Assistant:

int FormatTypeDSK::FillTrack(unsigned char* track_buffer, int side, int track)
{
   int j, N;

   int load_disk_index = 0;

   // GAP 4a : 80 byte with value 0x4E
   for (j = 0; j < 80; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   // Sync : 12 byte with value 0x00
   for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x00);

   // IAM : 3 byte with 0xC2, then one byte with 0xFC
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0xFC);

   // GAP 1 : 50 byte with 0x4E value
   for (j = 0; j < 50; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   unsigned int last_valid_data = 0;

   // Then, each sectors :
   for (unsigned int s = 0; s < side_[side].tracks[track].nb_sector; s++)
   {
      CRC crc;
      // - Sync : 12 byte, value #00
      crc.Reset();
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc, false);

      crc.Reset();
      // - IDAM : 3 byte #A1 + 1 byte #FE
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xFE, crc);

      // Index
      // - C (identification secteur 'C' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].track,
                                            crc);
      // - H (identification secteur 'H' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].side,
                                            crc);
      // - R (identification secteur 'R' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].sector_id,
                                            crc);
      // - N (identification secteur 'N' = 1 byte)
      N = side_[side].tracks[track].sectors[s].sector_size;
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, N, crc);

      // - Crc (2 bytes) - TODO ???
      //if (NsizeOfTrack_L == sizeOfTrack_L)
      //   if (false)
      {
         unsigned short computed_crc = crc.GetCRC();
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc >> 8), crc);
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc & 0xFF), crc);
      }

      crc.Reset();

      // - GAP 2 (22 bytes #4E)
      for (j = 0; j < 22; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x4E, crc);

      // - Sync : 12 bytes #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc);

      crc.Reset();
      // - DATA AM : 3 bytes #A1 + 1 bytes #FB ou #F8
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);

      if ((side_[side].tracks[track].sectors[s].fdc_status_2 & 0x40) == 0x40)
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_ERASED, crc);
      else
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_OFF, crc);

      // - n datas of sector (512 by default)
      unsigned int size_of_track = side_[side].tracks[track].sectors[s].actual_size;

      // With extension, CRC and GAP#3 are in the floppy
      for (unsigned int k = 0; k < size_of_track; k++)
      {
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index,
                                               side_[side].tracks[track].sectors[s].data[k], crc);
      }

      // - Crc (2 bytes) - If needed....
      unsigned short computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc >> 8));
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc & 0xFF));

      crc.Reset();

      // - GAP #3 (x bytes)
      for (j = 0; j < side_[side].tracks[track].gap3; j++)
      {
         load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, side_[side].tracks[track].gap3_filter);
      }
   }

   // End of track : GAP 4B until DEFAULT_TRACK_SIZE bytes.
   for (; load_disk_index < DEFAULT_TRACK_SIZE; load_disk_index++)
   {
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
   }

   return load_disk_index;
}